

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall amrex::TagBoxArray::mapPeriodicRemoveDuplicates(TagBoxArray *this,Geometry *geom)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  FabArray<amrex::TagBox> *this_00;
  FabArrayBase *fabarray_;
  FabArrayBase *in_RDI;
  Periodicity PVar6;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *msk;
  Array4<char> *tag;
  Box *box;
  MFIter mfi;
  unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> owner_mask;
  TagBoxArray tmp;
  MFIter *mfi_00;
  FabArray<amrex::IArrayBox> *this_01;
  FabArray<amrex::TagBox> *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  int iVar7;
  undefined8 in_stack_fffffffffffffb50;
  uchar flags_;
  long *plVar8;
  FabArray<amrex::TagBox> *in_stack_fffffffffffffb58;
  IntVect *dst_nghost;
  int local_47c;
  int local_478;
  int local_474;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  TagBoxArray *in_stack_fffffffffffffbb0;
  long local_430 [8];
  long *local_3f0;
  undefined8 local_3a8;
  undefined8 local_380;
  undefined8 in_stack_fffffffffffffca8;
  TagBoxArray *in_stack_fffffffffffffcb0;
  __uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
  local_2e0;
  int local_2d8;
  undefined1 local_2d0 [16];
  IntVect local_2c0;
  Array4<char> *local_2b0;
  int local_2a8;
  int local_2a0 [3];
  pointer local_290;
  int local_288;
  int local_280 [3];
  unique_ptr<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  local_270;
  int local_268;
  IntVect local_260 [23];
  IntVect *in_stack_fffffffffffffeb8;
  Periodicity *in_stack_fffffffffffffec0;
  FabArrayBase *in_stack_fffffffffffffec8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  this_00 = (FabArray<amrex::TagBox> *)FabArrayBase::boxArray(in_RDI);
  FabArrayBase::DistributionMap(in_RDI);
  local_280 = (int  [3])FabArrayBase::nGrowVect(in_RDI);
  local_268 = local_280[2];
  local_270._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::TagBox>_*,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::TagBox>_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>,_true,_true>
        )(__uniq_ptr_data<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>,_true,_true>
          )local_280._0_8_;
  dst_nghost = local_260;
  TagBoxArray(in_stack_fffffffffffffbb0,
              (BoxArray *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
              (DistributionMapping *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
              (IntVect *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  local_2a0 = (int  [3])FabArrayBase::nGrowVect(in_RDI);
  local_288 = local_2a0[2];
  local_290 = (pointer)local_2a0._0_8_;
  local_2c0 = FabArrayBase::nGrowVect(in_RDI);
  local_2a8 = local_2c0.vect[2];
  local_2b0 = (Array4<char> *)local_2c0.vect._0_8_;
  PVar6 = Geometry::periodicity((Geometry *)this_00);
  local_2d8 = PVar6.period.vect[2];
  local_2d0._8_4_ = local_2d8;
  local_2e0.super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
  _M_t.super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar6.period.vect._0_8_;
  local_2d0._0_8_ =
       local_2e0.
       super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
       super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
       super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
  mfi_00 = (MFIter *)local_2d0;
  FabArray<amrex::TagBox>::ParallelAdd
            (this_00,in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20),
             (int)in_stack_fffffffffffffb50,iVar7,(IntVect *)in_stack_fffffffffffffb40,dst_nghost,
             (Periodicity *)in_RDI);
  flags_ = (uchar)((ulong)in_stack_fffffffffffffb50 >> 0x38);
  fabarray_ = (FabArrayBase *)Periodicity::NonPeriodic();
  FabArrayBase::nGrowVect(in_RDI);
  OwnerMask(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  MFIter::MFIter((MFIter *)this_00,fabarray_,flags_);
  while (bVar5 = MFIter::isValid((MFIter *)&stack0xfffffffffffffc88), bVar5) {
    this_01 = (FabArray<amrex::IArrayBox> *)&stack0xfffffffffffffc64;
    MFIter::fabbox((MFIter *)in_stack_fffffffffffffb40);
    in_stack_fffffffffffffb40 = (FabArray<amrex::TagBox> *)&stack0xfffffffffffffc18;
    local_380 = this_01;
    FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(in_stack_fffffffffffffb40,(MFIter *)this_01);
    local_3a8 = in_stack_fffffffffffffb40;
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x135fe28);
    plVar8 = local_430;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(this_01,mfi_00);
    iVar7 = *(int *)local_380;
    iVar1 = *(int *)(local_380 + 4);
    uVar2 = (((BATOp *)(local_380 + 0xc))->m_indexType).m_typ.itype;
    iVar3 = ((IntVect *)(local_380 + 0x10))->vect[0];
    iVar4 = *(int *)(local_380 + 0x14);
    for (local_474 = (((BoxArray *)(local_380 + 8))->m_bat).m_bat_type; local_478 = iVar1,
        local_474 <= iVar4; local_474 = local_474 + 1) {
      for (; local_47c = iVar7, local_478 <= iVar3; local_478 = local_478 + 1) {
        for (; local_47c <= (int)uVar2; local_47c = local_47c + 1) {
          if (*(int *)(*plVar8 +
                      ((long)(local_47c - (int)plVar8[4]) +
                       (long)(local_478 - *(int *)((long)plVar8 + 0x24)) * plVar8[1] +
                      (long)(local_474 - (int)plVar8[5]) * plVar8[2]) * 4) == 0) {
            *(undefined1 *)
             (*(long *)local_3a8 +
             (long)(local_47c - *(int *)(local_3a8 + 0x20)) +
             (long)(local_478 - *(int *)(local_3a8 + 0x24)) *
             *(long *)&((BoxArray *)(local_3a8 + 8))->m_bat +
             (long)(local_474 - *(int *)(local_3a8 + 0x28)) * *(long *)(local_3a8 + 0x10)) = 0;
          }
        }
      }
    }
    local_3f0 = plVar8;
    MFIter::operator++((MFIter *)&stack0xfffffffffffffc88);
  }
  MFIter::~MFIter(mfi_00);
  std::swap<amrex::TagBoxArray>(in_stack_fffffffffffffcb0,(TagBoxArray *)in_stack_fffffffffffffca8);
  std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::~unique_ptr
            ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
             in_stack_fffffffffffffb40);
  ~TagBoxArray((TagBoxArray *)0x1360215);
  return;
}

Assistant:

void
TagBoxArray::mapPeriodicRemoveDuplicates (const Geometry& geom)
{
    BL_PROFILE("TagBoxArray::mapPRD");

    if (Gpu::inLaunchRegion())
    {
        // There is not atomicAdd for char.  So we have to use int.
        iMultiFab itag = amrex::cast<iMultiFab>(*this);
        iMultiFab tmp(boxArray(),DistributionMap(),1,nGrowVect());
        tmp.setVal(0);
        tmp.ParallelAdd(itag, 0, 0, 1, nGrowVect(), nGrowVect(), geom.periodicity());

        // We need to keep tags in periodic boundary
        const auto owner_mask = amrex::OwnerMask(tmp, Periodicity::NonPeriodic(), nGrowVect());
        for (MFIter mfi(tmp); mfi.isValid(); ++mfi) {
            Box const& box = mfi.fabbox();
            Array4<TagType> const& tag =this->array(mfi);
            Array4<int const> const& tmptag = tmp.const_array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            amrex::ParallelFor(box,
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                if (msk(i,j,k)) {
                    tag(i,j,k) = static_cast<char>(tmptag(i,j,k));
                } else {
                    tag(i,j,k) = TagBox::CLEAR;
                }
            });
        }
    }
    else
    {
        TagBoxArray tmp(boxArray(),DistributionMap(),nGrowVect()); // note that tmp is filled w/ CLEAR.
        tmp.ParallelAdd(*this, 0, 0, 1, nGrowVect(), nGrowVect(), geom.periodicity());

        // We need to keep tags in periodic boundary
        const auto owner_mask = amrex::OwnerMask(tmp, Periodicity::NonPeriodic(), nGrowVect());
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(tmp); mfi.isValid(); ++mfi) {
            Box const& box = mfi.fabbox();
            Array4<TagType> const& tag = tmp.array(mfi);
            Array4<int const> const& msk = owner_mask->const_array(mfi);
            AMREX_LOOP_3D(box, i, j, k,
            {
                if (!msk(i,j,k)) tag(i,j,k) = TagBox::CLEAR;
            });
        }

        std::swap(*this, tmp);
    }
}